

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

duckdb_type duckdb_param_type(duckdb_prepared_statement prepared_statement,idx_t param_idx)

{
  duckdb_type dVar1;
  LogicalType *sql_type;
  LogicalType *logical_type;
  
  sql_type = (LogicalType *)duckdb_param_logical_type(prepared_statement,param_idx);
  if (sql_type == (LogicalType *)0x0) {
    dVar1 = DUCKDB_TYPE_INVALID;
  }
  else {
    dVar1 = duckdb::ConvertCPPTypeToC(sql_type);
    duckdb::LogicalType::~LogicalType(sql_type);
    operator_delete(sql_type);
  }
  return dVar1;
}

Assistant:

duckdb_type duckdb_param_type(duckdb_prepared_statement prepared_statement, idx_t param_idx) {
	auto logical_type = duckdb_param_logical_type(prepared_statement, param_idx);
	if (!logical_type) {
		return DUCKDB_TYPE_INVALID;
	}

	auto type = duckdb_get_type_id(logical_type);

	duckdb_destroy_logical_type(&logical_type);

	return type;
}